

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

void __thiscall BpTree<int>::DeleteNode(BpTree<int> *this,IndexNode<int> *Node)

{
  int *__args;
  iterator __position;
  pointer pcVar1;
  int iVar2;
  size_t __n;
  Block B;
  string local_2078;
  long *local_2058;
  size_t local_2050;
  long local_2048 [2];
  int local_2038 [2050];
  
  __args = &(Node->self).FileOff;
  __position._M_current =
       (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->FileOff_bin,__position,__args);
  }
  else {
    *__position._M_current = *__args;
    (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  iVar2 = (Node->self).BlockNum;
  pcVar1 = blocks.buffer[iVar2].FileName._M_dataplus._M_p;
  local_2058 = local_2048;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2058,pcVar1,pcVar1 + blocks.buffer[iVar2].FileName._M_string_length);
  memcpy(local_2038,&blocks.buffer[iVar2].FileOff,0x2004);
  if ((Node->self).FileOff == local_2038[0]) {
    __n = (this->Index_FileName)._M_string_length;
    if ((__n == local_2050) &&
       ((__n == 0 ||
        (iVar2 = bcmp((this->Index_FileName)._M_dataplus._M_p,local_2058,__n), iVar2 == 0))))
    goto LAB_00137259;
  }
  else {
    __n = (this->Index_FileName)._M_string_length;
  }
  pcVar1 = (this->Index_FileName)._M_dataplus._M_p;
  local_2078._M_dataplus._M_p = (pointer)&local_2078.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2078,pcVar1,pcVar1 + __n);
  iVar2 = Buffer::Allocate(&blocks,&local_2078,*__args);
  (Node->self).BlockNum = iVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2078._M_dataplus._M_p != &local_2078.field_2) {
    operator_delete(local_2078._M_dataplus._M_p,local_2078.field_2._M_allocated_capacity + 1);
  }
LAB_00137259:
  Buffer::Free(&blocks,(Node->self).BlockNum);
  if (local_2058 != local_2048) {
    operator_delete(local_2058,local_2048[0] + 1);
  }
  return;
}

Assistant:

void BpTree<K>::DeleteNode(IndexNode<K> &Node) {
	this->FileOff_bin.push_back(Node.self.FileOff);
	Block B = blocks.buffer[Node.self.BlockNum];
	if (Node.self.FileOff != B.FileOff || this->Index_FileName != B.FileName) {
		//�����һ���Ѿ�������ռ�죬��Ҫ����µ�һ��
		Node.self.BlockNum = blocks.Allocate(this->Index_FileName, Node.self.FileOff);
	}
	blocks.Free(Node.self.BlockNum);
}